

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<Info,_(wasm::Mutability)1,_wasm::ModuleUtils::DefaultMap>::doAnalysis::
Mapper::~Mapper(Mapper *this)

{
  Mapper *this_local;
  
  ~Mapper(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }